

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_coarsen.cpp
# Opt level: O0

bool Omega_h::coarsen_ghosted(Mesh *mesh,AdaptOpts *opts,OvershootLimit overshoot,Improve improve)

{
  bool bVar1;
  Int to;
  element_type *peVar2;
  Real local_4f0;
  Graph local_4e0;
  Read<int> local_4c0;
  Read<signed_char> local_4b0;
  undefined1 local_4a0 [8];
  LOs keys2verts;
  allocator local_479;
  string local_478 [32];
  Read<double> local_458;
  allocator local_441;
  string local_440 [32];
  Read<signed_char> local_420;
  allocator local_409;
  string local_408 [32];
  Adj local_3e8;
  undefined1 local_3b8 [8];
  Graph verts2cav_elems;
  Read<double> local_388;
  undefined1 local_378 [8];
  Read<signed_char> verts_are_keys;
  Read<signed_char> local_358;
  Read<int> local_348;
  undefined1 local_338 [8];
  Read<long> vert_rails;
  Reals vert_quals;
  Read<signed_char> verts_are_cands;
  Read<signed_char> local_2f8;
  Read<int> local_2e8;
  Read<signed_char> local_2d8;
  Read<double> local_2c8;
  Read<signed_char> local_2b8;
  Read<signed_char> local_2a8;
  Read<signed_char> local_298;
  Read<int> local_288;
  undefined1 local_278 [8];
  Reals cand_edge_quals;
  Read<int> local_258;
  Read<signed_char> local_248;
  undefined4 local_234;
  Read<signed_char> local_230;
  Read<int> local_220;
  Read<signed_char> local_210;
  Real local_200;
  Real max_length;
  Read<int> local_1e8;
  Read<signed_char> local_1d8;
  Read<signed_char> local_1c8;
  Read<int> local_1b8;
  Write<signed_char> local_1a8;
  undefined1 local_198 [8];
  Read<signed_char> cand_edge_codes;
  undefined1 local_178 [8];
  LOs cands2edges;
  undefined1 local_158 [8];
  Bytes edges_are_cands;
  undefined1 local_138 [8];
  Read<signed_char> edge_cand_codes;
  CommPtr comm;
  Improve improve_local;
  OvershootLimit overshoot_local;
  AdaptOpts *opts_local;
  Mesh *mesh_local;
  ulong local_90;
  ulong local_80;
  ulong local_70;
  
  Mesh::comm((Mesh *)&edge_cand_codes.write_.shared_alloc_.direct_ptr);
  get_edge_codes((Omega_h *)local_138,mesh);
  Read<signed_char>::Read
            ((Read<signed_char> *)&cands2edges.write_.shared_alloc_.direct_ptr,
             (Read<signed_char> *)local_138);
  each_neq_to<signed_char>
            ((Omega_h *)local_158,(Read<signed_char> *)&cands2edges.write_.shared_alloc_.direct_ptr,
             '\0');
  Read<signed_char>::~Read((Read<signed_char> *)&cands2edges.write_.shared_alloc_.direct_ptr);
  Read<signed_char>::Read
            ((Read<signed_char> *)&cand_edge_codes.write_.shared_alloc_.direct_ptr,
             (Read<signed_char> *)local_158);
  collect_marked((Omega_h *)local_178,
                 (Read<signed_char> *)&cand_edge_codes.write_.shared_alloc_.direct_ptr);
  Read<signed_char>::~Read((Read<signed_char> *)&cand_edge_codes.write_.shared_alloc_.direct_ptr);
  Read<int>::Read(&local_1b8,(Read<int> *)local_178);
  Read<signed_char>::Read(&local_1c8,(Read<signed_char> *)local_138);
  unmap<signed_char>((Omega_h *)&local_1a8,&local_1b8,&local_1c8,1);
  read<signed_char>((Omega_h *)local_198,&local_1a8);
  Write<signed_char>::~Write(&local_1a8);
  Read<signed_char>::~Read(&local_1c8);
  Read<int>::~Read(&local_1b8);
  Read<int>::Read(&local_1e8,(Read<int> *)local_178);
  Read<signed_char>::Read((Read<signed_char> *)&max_length,(Read<signed_char> *)local_198);
  check_collapse_exposure((Omega_h *)&local_1d8,mesh,&local_1e8,(Read<signed_char> *)&max_length);
  Read<signed_char>::operator=((Read<signed_char> *)local_198,&local_1d8);
  Read<signed_char>::~Read(&local_1d8);
  Read<signed_char>::~Read((Read<signed_char> *)&max_length);
  Read<int>::~Read(&local_1e8);
  filter_coarsen_candidates((LOs *)local_178,(Read<signed_char> *)local_198,(Reals *)0x0);
  if (overshoot == DESIRED) {
    local_4f0 = opts->max_length_desired;
  }
  else {
    local_4f0 = opts->max_length_allowed;
  }
  local_200 = local_4f0;
  Read<int>::Read(&local_220,(Read<int> *)local_178);
  Read<signed_char>::Read(&local_230,(Read<signed_char> *)local_198);
  prevent_coarsen_overshoot((Omega_h *)&local_210,mesh,local_4f0,&local_220,&local_230);
  Read<signed_char>::operator=((Read<signed_char> *)local_198,&local_210);
  Read<signed_char>::~Read(&local_210);
  Read<signed_char>::~Read(&local_230);
  Read<int>::~Read(&local_220);
  filter_coarsen_candidates((LOs *)local_178,(Read<signed_char> *)local_198,(Reals *)0x0);
  peVar2 = std::__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&edge_cand_codes.write_.shared_alloc_.direct_ptr);
  if (((ulong)local_178 & 1) == 0) {
    local_70 = *(size_t *)local_178;
  }
  else {
    local_70 = (ulong)local_178 >> 3;
  }
  bVar1 = Comm::reduce_and(peVar2,(int)(local_70 >> 2) == 0);
  if (bVar1) {
    mesh_local._7_1_ = false;
    local_234 = 1;
  }
  else {
    if ((opts->should_prevent_coarsen_flip & 1U) != 0) {
      Read<int>::Read(&local_258,(Read<int> *)local_178);
      Read<signed_char>::Read
                ((Read<signed_char> *)&cand_edge_quals.write_.shared_alloc_.direct_ptr,
                 (Read<signed_char> *)local_198);
      prevent_coarsen_flip
                ((Omega_h *)&local_248,mesh,&local_258,
                 (Bytes *)&cand_edge_quals.write_.shared_alloc_.direct_ptr);
      Read<signed_char>::operator=((Read<signed_char> *)local_198,&local_248);
      Read<signed_char>::~Read(&local_248);
      Read<signed_char>::~Read
                ((Read<signed_char> *)&cand_edge_quals.write_.shared_alloc_.direct_ptr);
      Read<int>::~Read(&local_258);
      filter_coarsen_candidates((LOs *)local_178,(Read<signed_char> *)local_198,(Reals *)0x0);
      peVar2 = std::__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&edge_cand_codes.write_.shared_alloc_.direct_ptr);
      if (((ulong)local_178 & 1) == 0) {
        local_80 = *(size_t *)local_178;
      }
      else {
        local_80 = (ulong)local_178 >> 3;
      }
      bVar1 = Comm::reduce_and(peVar2,(int)(local_80 >> 2) == 0);
      if (bVar1) {
        mesh_local._7_1_ = false;
        local_234 = 1;
        goto LAB_003abb38;
      }
    }
    Read<int>::Read(&local_288,(Read<int> *)local_178);
    Read<signed_char>::Read(&local_298,(Read<signed_char> *)local_198);
    coarsen_qualities((Omega_h *)local_278,mesh,&local_288,&local_298);
    Read<signed_char>::~Read(&local_298);
    Read<int>::~Read(&local_288);
    Read<signed_char>::Read(&local_2b8,(Read<signed_char> *)local_198);
    Read<double>::Read(&local_2c8,(Read<double> *)local_278);
    filter_coarsen_min_qual((Omega_h *)&local_2a8,&local_2b8,&local_2c8,opts->min_quality_allowed);
    Read<signed_char>::operator=((Read<signed_char> *)local_198,&local_2a8);
    Read<signed_char>::~Read(&local_2a8);
    Read<double>::~Read(&local_2c8);
    Read<signed_char>::~Read(&local_2b8);
    if (improve == IMPROVE_LOCALLY) {
      Read<int>::Read(&local_2e8,(Read<int> *)local_178);
      Read<signed_char>::Read(&local_2f8,(Read<signed_char> *)local_198);
      Read<double>::Read((Read<double> *)&verts_are_cands.write_.shared_alloc_.direct_ptr,
                         (Read<double> *)local_278);
      filter_coarsen_improve
                ((Omega_h *)&local_2d8,mesh,&local_2e8,&local_2f8,
                 (Reals *)&verts_are_cands.write_.shared_alloc_.direct_ptr);
      Read<signed_char>::operator=((Read<signed_char> *)local_198,&local_2d8);
      Read<signed_char>::~Read(&local_2d8);
      Read<double>::~Read((Read<double> *)&verts_are_cands.write_.shared_alloc_.direct_ptr);
      Read<signed_char>::~Read(&local_2f8);
      Read<int>::~Read(&local_2e8);
    }
    filter_coarsen_candidates((LOs *)local_178,(Read<signed_char> *)local_198,(Reals *)local_278);
    peVar2 = std::__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&edge_cand_codes.write_.shared_alloc_.direct_ptr);
    if (((ulong)local_178 & 1) == 0) {
      local_90 = *(size_t *)local_178;
    }
    else {
      local_90 = (ulong)local_178 >> 3;
    }
    bVar1 = Comm::reduce_and(peVar2,(int)(local_90 >> 2) == 0);
    if (bVar1) {
      local_234 = 1;
    }
    else {
      vert_quals.write_.shared_alloc_.direct_ptr = (void *)0x0;
      verts_are_cands.write_.shared_alloc_.alloc = (Alloc *)0x0;
      vert_rails.write_.shared_alloc_.direct_ptr = (void *)0x0;
      vert_quals.write_.shared_alloc_.alloc = (Alloc *)0x0;
      local_338 = (undefined1  [8])0x0;
      vert_rails.write_.shared_alloc_.alloc = (Alloc *)0x0;
      Read<int>::Read(&local_348,(Read<int> *)local_178);
      Read<signed_char>::Read(&local_358,(Read<signed_char> *)local_198);
      Read<double>::Read((Read<double> *)&verts_are_keys.write_.shared_alloc_.direct_ptr,
                         (Read<double> *)local_278);
      choose_rails(mesh,&local_348,&local_358,
                   (Reals *)&verts_are_keys.write_.shared_alloc_.direct_ptr,
                   (Read<signed_char> *)&vert_quals.write_.shared_alloc_.direct_ptr,
                   (Reals *)&vert_rails.write_.shared_alloc_.direct_ptr,(Read<long> *)local_338);
      Read<double>::~Read((Read<double> *)&verts_are_keys.write_.shared_alloc_.direct_ptr);
      Read<signed_char>::~Read(&local_358);
      Read<int>::~Read(&local_348);
      Read<double>::Read(&local_388,(Read<double> *)&vert_rails.write_.shared_alloc_.direct_ptr);
      Read<signed_char>::Read
                ((Read<signed_char> *)&verts2cav_elems.ab2b.write_.shared_alloc_.direct_ptr,
                 (Read<signed_char> *)&vert_quals.write_.shared_alloc_.direct_ptr);
      find_indset((Omega_h *)local_378,mesh,0,&local_388,
                  (Read<signed_char> *)&verts2cav_elems.ab2b.write_.shared_alloc_.direct_ptr);
      Read<signed_char>::~Read
                ((Read<signed_char> *)&verts2cav_elems.ab2b.write_.shared_alloc_.direct_ptr);
      Read<double>::~Read(&local_388);
      local_3b8 = (undefined1  [8])0x0;
      verts2cav_elems.a2ab.write_.shared_alloc_.alloc = (Alloc *)0x0;
      verts2cav_elems.a2ab.write_.shared_alloc_.direct_ptr = (void *)0x0;
      verts2cav_elems.ab2b.write_.shared_alloc_.alloc = (Alloc *)0x0;
      to = Mesh::dim(mesh);
      Mesh::ask_up(&local_3e8,mesh,0,to);
      Graph::operator=((Graph *)local_3b8,&local_3e8.super_Graph);
      Adj::~Adj(&local_3e8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_408,"key",&local_409);
      Read<signed_char>::Read(&local_420,(Read<signed_char> *)local_378);
      Mesh::add_tag<signed_char>(mesh,0,(string *)local_408,1,&local_420,false);
      Read<signed_char>::~Read(&local_420);
      std::__cxx11::string::~string(local_408);
      std::allocator<char>::~allocator((allocator<char> *)&local_409);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_440,"collapse_quality",&local_441);
      Read<double>::Read(&local_458,(Read<double> *)&vert_rails.write_.shared_alloc_.direct_ptr);
      Mesh::add_tag<double>(mesh,0,(string *)local_440,1,&local_458,false);
      Read<double>::~Read(&local_458);
      std::__cxx11::string::~string(local_440);
      std::allocator<char>::~allocator((allocator<char> *)&local_441);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_478,"collapse_rail",&local_479);
      Read<long>::Read((Read<long> *)&keys2verts.write_.shared_alloc_.direct_ptr,
                       (Read<int> *)local_338);
      Mesh::add_tag<long>(mesh,0,(string *)local_478,1,
                          (Read<long> *)&keys2verts.write_.shared_alloc_.direct_ptr,false);
      Read<long>::~Read((Read<long> *)&keys2verts.write_.shared_alloc_.direct_ptr);
      std::__cxx11::string::~string(local_478);
      std::allocator<char>::~allocator((allocator<char> *)&local_479);
      Read<signed_char>::Read(&local_4b0,(Read<signed_char> *)local_378);
      collect_marked((Omega_h *)local_4a0,&local_4b0);
      Read<signed_char>::~Read(&local_4b0);
      Read<int>::Read(&local_4c0,(Read<int> *)local_4a0);
      Graph::Graph(&local_4e0,(Graph *)local_3b8);
      set_owners_by_indset(mesh,0,&local_4c0,&local_4e0);
      Graph::~Graph(&local_4e0);
      Read<int>::~Read(&local_4c0);
      local_234 = 1;
      Read<int>::~Read((Read<int> *)local_4a0);
      Graph::~Graph((Graph *)local_3b8);
      Read<signed_char>::~Read((Read<signed_char> *)local_378);
      Read<long>::~Read((Read<long> *)local_338);
      Read<double>::~Read((Read<double> *)&vert_rails.write_.shared_alloc_.direct_ptr);
      Read<signed_char>::~Read((Read<signed_char> *)&vert_quals.write_.shared_alloc_.direct_ptr);
    }
    mesh_local._7_1_ = !bVar1;
    Read<double>::~Read((Read<double> *)local_278);
  }
LAB_003abb38:
  Read<signed_char>::~Read((Read<signed_char> *)local_198);
  Read<int>::~Read((Read<int> *)local_178);
  Read<signed_char>::~Read((Read<signed_char> *)local_158);
  Read<signed_char>::~Read((Read<signed_char> *)local_138);
  std::shared_ptr<Omega_h::Comm>::~shared_ptr
            ((shared_ptr<Omega_h::Comm> *)&edge_cand_codes.write_.shared_alloc_.direct_ptr);
  return mesh_local._7_1_;
}

Assistant:

static bool coarsen_ghosted(Mesh* mesh, AdaptOpts const& opts,
    OvershootLimit overshoot, Improve improve) {
  auto comm = mesh->comm();
  auto edge_cand_codes = get_edge_codes(mesh);
  auto edges_are_cands = each_neq_to(edge_cand_codes, I8(DONT_COLLAPSE));
  auto cands2edges = collect_marked(edges_are_cands);
  auto cand_edge_codes = read(unmap(cands2edges, edge_cand_codes, 1));
  /* surface exposure (classification) checks */
  cand_edge_codes = check_collapse_exposure(mesh, cands2edges, cand_edge_codes);
  filter_coarsen_candidates(&cands2edges, &cand_edge_codes);
  /* edge length overshoot check */
  auto max_length = (overshoot == DESIRED) ? opts.max_length_desired
                                           : opts.max_length_allowed;
  cand_edge_codes =
      prevent_coarsen_overshoot(mesh, max_length, cands2edges, cand_edge_codes);
  filter_coarsen_candidates(&cands2edges, &cand_edge_codes);
  if (comm->reduce_and(cands2edges.size() == 0)) return false;
  #ifndef _MSC_VER
  if (opts.should_prevent_coarsen_flip) {
    cand_edge_codes = prevent_coarsen_flip(mesh, cands2edges, cand_edge_codes);
    filter_coarsen_candidates(&cands2edges, &cand_edge_codes);
    if (comm->reduce_and(cands2edges.size() == 0)) return false;
  }
  #endif
  /* cavity quality checks */
  auto cand_edge_quals = coarsen_qualities(mesh, cands2edges, cand_edge_codes);
  cand_edge_codes = filter_coarsen_min_qual(
      cand_edge_codes, cand_edge_quals, opts.min_quality_allowed);
  if (improve == IMPROVE_LOCALLY) {
    cand_edge_codes = filter_coarsen_improve(
        mesh, cands2edges, cand_edge_codes, cand_edge_quals);
  }
  filter_coarsen_candidates(&cands2edges, &cand_edge_codes, &cand_edge_quals);
  /* finished cavity quality checks */
  if (comm->reduce_and(cands2edges.size() == 0)) return false;
  auto verts_are_cands = Read<I8>();
  auto vert_quals = Reals();
  auto vert_rails = Read<GO>();
  choose_rails(mesh, cands2edges, cand_edge_codes, cand_edge_quals,
      &verts_are_cands, &vert_quals, &vert_rails);
  auto verts_are_keys = find_indset(mesh, VERT, vert_quals, verts_are_cands);
  Graph verts2cav_elems;
  verts2cav_elems = mesh->ask_up(VERT, mesh->dim());
  mesh->add_tag(VERT, "key", 1, verts_are_keys);
  mesh->add_tag(VERT, "collapse_quality", 1, vert_quals);
  mesh->add_tag(VERT, "collapse_rail", 1, vert_rails);
  auto keys2verts = collect_marked(verts_are_keys);
  set_owners_by_indset(mesh, VERT, keys2verts, verts2cav_elems);
  return true;
}